

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

string * r_code::Utils::GetString<r_code::Code>
                   (string *__return_storage_ptr__,Code *object,uint16_t index)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  undefined6 in_register_00000012;
  ulong uVar5;
  char buffer [255];
  allocator local_129;
  char local_128 [256];
  
  (*(object->super__Object)._vptr__Object[5])
            (object,CONCAT62(in_register_00000012,index) & 0xffffffff);
  uVar2 = r_code::Atom::asIndex();
  iVar3 = (*(object->super__Object)._vptr__Object[5])(object,(ulong)uVar2 & 0xffff);
  bVar1 = *(byte *)CONCAT44(extraout_var,iVar3);
  local_128[bVar1] = '\0';
  for (uVar5 = 0; uVar5 < bVar1; uVar5 = uVar5 + 4) {
    uVar2 = uVar2 + 1 & 0xffff;
    iVar3 = (*(object->super__Object)._vptr__Object[5])(object,(ulong)uVar2);
    uVar4 = r_code::Atom::operator_cast_to_unsigned_long((Atom *)CONCAT44(extraout_var_00,iVar3));
    *(int *)(local_128 + uVar5) = (int)uVar4;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_128,&local_129);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetString(const O *object, uint16_t index)
    {
        uint16_t s_index = object->code(index).asIndex();
        char buffer[255];
        uint8_t char_count = (object->code(s_index).atom & 0x000000FF);
        buffer[char_count] = 0;

        for (int i = 0; i < char_count; i += 4) {
            uint64_t val = object->code(s_index + 1 + i / 4);
            buffer[i] = (val & 0x000000ff);
            buffer[i + 1] = (val & 0x0000ff00) >> 8;
            buffer[i + 2] = (val & 0x00ff0000) >> 16;
            buffer[i + 3] = (val & 0xff000000) >> 24;
        }

        return std::string(buffer);
    }